

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshFace::Repair(ON_MeshFace *this,int mesh_vertex_count,ON_3dPoint *V)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar10;
  ON_MeshFace local_58;
  uint local_3c;
  long local_38;
  ulong uVar9;
  
  local_58.vi[0] = 0xffffffff;
  local_58.vi[1] = 0xffffffff;
  local_58.vi[2] = 0xffffffff;
  local_58.vi[3] = 0xffffffff;
  uVar6 = this->vi[0];
  uVar10 = 0;
  bVar5 = true;
  if (((int)uVar6 < mesh_vertex_count && -1 < (int)uVar6) &&
     (bVar4 = ON_3dPoint::IsValid(V + uVar6), bVar4)) {
    local_58.vi[0] = this->vi[0];
    uVar10 = 1;
    bVar5 = false;
  }
  iVar2 = local_58.vi[0];
  uVar6 = this->vi[1];
  uVar9 = uVar10;
  if ((local_58.vi[0] != uVar6 && ((int)uVar6 < mesh_vertex_count && -1 < (int)uVar6)) &&
     (bVar4 = ON_3dPoint::IsValid(V + uVar6), bVar4)) {
    if (!bVar5) {
      bVar5 = ON_3dPoint::operator!=(V + iVar2,V + this->vi[1]);
      uVar9 = 1;
      if (!bVar5) goto LAB_004fdd52;
    }
    uVar9 = (ulong)((int)uVar10 + 1);
    local_58.vi[uVar10] = this->vi[1];
  }
LAB_004fdd52:
  iVar3 = local_58.vi[1];
  iVar2 = local_58.vi[0];
  iVar8 = (int)uVar9;
  if (iVar8 == 0) {
    return false;
  }
  uVar6 = this->vi[2];
  local_38 = (long)local_58.vi[0];
  uVar10 = uVar9;
  if ((((local_58.vi[1] != uVar6 && local_58.vi[0] != uVar6) &&
        ((int)uVar6 < mesh_vertex_count && -1 < (int)uVar6)) &&
      (bVar5 = ON_3dPoint::IsValid(V + uVar6), bVar5)) &&
     (bVar5 = ON_3dPoint::operator!=(V + local_38,V + this->vi[2]), bVar5)) {
    if (iVar8 != 1) {
      bVar5 = ON_3dPoint::operator!=(V + iVar3,V + this->vi[2]);
      uVar10 = 2;
      if (!bVar5) goto LAB_004fde00;
    }
    uVar10 = (ulong)(iVar8 + 1);
    local_58.vi[uVar9] = this->vi[2];
  }
LAB_004fde00:
  iVar3 = local_58.vi[1];
  uVar6 = (uint)uVar10;
  if (uVar6 < 2) {
    return false;
  }
  uVar1 = this->vi[3];
  uVar7 = uVar6;
  if (local_58.vi[2] != uVar1 &&
      ((local_58.vi[1] != uVar1 && iVar2 != uVar1) &&
      ((int)uVar1 < mesh_vertex_count && -1 < (int)uVar1))) {
    local_3c = local_58.vi[2];
    bVar5 = ON_3dPoint::IsValid(V + uVar1);
    if (((bVar5) && (bVar5 = ON_3dPoint::operator!=(V + local_38,V + this->vi[3]), bVar5)) &&
       (bVar5 = ON_3dPoint::operator!=(V + iVar3,V + this->vi[3]), bVar5)) {
      if (uVar6 != 2) {
        bVar5 = ON_3dPoint::operator!=(V + (int)local_3c,V + this->vi[3]);
        uVar7 = 3;
        if (!bVar5) goto LAB_004fded8;
      }
      uVar7 = uVar6 + 1;
      local_58.vi[uVar10] = this->vi[3];
    }
  }
LAB_004fded8:
  if (2 < uVar7) {
    if (uVar7 == 3) {
      local_58.vi[3] = local_58.vi[2];
    }
    bVar5 = IsValid(&local_58,mesh_vertex_count);
    if (bVar5) {
      this->vi[0] = iVar2;
      this->vi[1] = local_58.vi[1];
      this->vi[2] = local_58.vi[2];
      this->vi[3] = local_58.vi[3];
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_MeshFace::Repair(
  int mesh_vertex_count,
  const ON_3dPoint* V
  )
{
  ON_MeshFace f;
  int fvi_count = 0;
  f.vi[0] = f.vi[1] = f.vi[2] = f.vi[3] = -1;
  
  if ( vi[0] >= 0 && vi[0] < mesh_vertex_count && V[vi[0]].IsValid() )
    f.vi[fvi_count++] = vi[0];

  if (vi[1] >= 0 && vi[1] < mesh_vertex_count && f.vi[0] != vi[1] && V[vi[1]].IsValid())
  {
    if ( 0 == fvi_count || V[f.vi[0]] != V[vi[1]] )
      f.vi[fvi_count++] = vi[1];
  }

  if ( fvi_count < 1 )
    return false;

  if ( vi[2] >= 0 && vi[2] < mesh_vertex_count && f.vi[0] != vi[2] && f.vi[1] != vi[2] && V[vi[2]].IsValid() && V[f.vi[0]] != V[vi[2]] )
  {
    if ( 1 == fvi_count || V[f.vi[1]] != V[vi[2]] )
      f.vi[fvi_count++] = vi[2];
  }

  if ( fvi_count < 2 )
    return false;

  if ( vi[3] >= 0 && vi[3] < mesh_vertex_count && f.vi[0] != vi[3] && f.vi[1] != vi[3] && f.vi[2] != vi[3] && V[vi[3]].IsValid() && V[f.vi[0]] != V[vi[3]] && V[f.vi[1]] != V[vi[3]] )
  {
    if ( 2 == fvi_count || V[f.vi[2]] != V[vi[3]] )
      f.vi[fvi_count++] = vi[3];
  }
  
  if ( fvi_count < 3 )
    return false;
 
  if ( 3 == fvi_count )
    f.vi[3] = f.vi[2];
  
  if ( !f.IsValid(mesh_vertex_count) )
    return false;

  vi[0] = f.vi[0];
  vi[1] = f.vi[1];
  vi[2] = f.vi[2];
  vi[3] = f.vi[3];

  return true;
}